

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O1

void __thiscall QByteArrayView::QByteArrayView<11ul>(QByteArrayView *this,char (*data) [11])

{
  char (*pacVar1) [11];
  char (*pacVar2) [11];
  
  pacVar1 = (char (*) [11])memchr(data,0,0xb);
  pacVar2 = data + 1;
  if (pacVar1 != (char (*) [11])0x0) {
    pacVar2 = pacVar1;
  }
  this->m_size = (long)pacVar2 - (long)data;
  this->m_data = *data;
  return;
}

Assistant:

constexpr QByteArrayView(const char (&data)[Size]) noexcept
        : QByteArrayView(data, lengthHelperCharArray(data, Size)) {}